

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O2

Gem_Man_t * Gem_ManAlloc(int nVars,int fVerbose)

{
  size_t __size;
  word wVar1;
  int iVar2;
  Gem_Man_t *p;
  Gem_Obj_t *pGVar3;
  word *pwVar4;
  Vec_Mem_t *p_00;
  Vec_Int_t *pVVar5;
  word **ppwVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int nRows;
  ulong uVar10;
  
  if (0x10 < nVars) {
    __assert_fail("nVars <= 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMaj.c"
                  ,0x5a,"Gem_Man_t *Gem_ManAlloc(int, int)");
  }
  p = (Gem_Man_t *)calloc(1,0x30);
  uVar10 = (ulong)(uint)(1 << ((char)nVars - 6U & 0x1f));
  if (nVars < 7) {
    uVar10 = 1;
  }
  p->nVars = nVars;
  nRows = (int)uVar10;
  p->nWords = nRows;
  p->nObjsAlloc = 10000000;
  p->nObjs = 2;
  pGVar3 = (Gem_Obj_t *)calloc(10000000,8);
  p->pObjs = pGVar3;
  *(undefined4 *)(pGVar3 + 1) = 0x10001;
  __size = uVar10 * 8;
  pwVar4 = (word *)malloc(__size);
  p_00 = (Vec_Mem_t *)calloc(1,0x30);
  p_00->nEntrySize = nRows;
  p_00->LogPageSze = 0xc;
  p_00->PageMask = 0xfff;
  p_00->iPage = -1;
  iVar2 = Abc_PrimeCudd(10000);
  pVVar5 = Vec_IntAlloc(iVar2);
  pVVar5->nSize = iVar2;
  if (pVVar5->pArray != (int *)0x0) {
    memset(pVVar5->pArray,0xff,(long)iVar2 << 2);
  }
  p_00->vTable = pVVar5;
  pVVar5 = Vec_IntAlloc(10000);
  p_00->vNexts = pVVar5;
  memset(pwVar4,0,__size);
  iVar2 = Vec_MemHashInsert(p_00,pwVar4);
  if (iVar2 != 0) {
    __assert_fail("Value == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x19e,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  memset(pwVar4,0xaa,__size);
  iVar2 = Vec_MemHashInsert(p_00,pwVar4);
  if (iVar2 != 1) {
    __assert_fail("Value == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                  ,0x1a3,"Vec_Mem_t *Vec_MemAllocForTT(int, int)");
  }
  free(pwVar4);
  p->vTtMem = p_00;
  ppwVar6 = (word **)Extra_ArrayAlloc(nVars + 4,nRows,8);
  p->pTtElems = ppwVar6;
  p->fVerbose = fVerbose;
  uVar7 = 0;
  uVar8 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar8 = uVar7;
  }
  for (; uVar7 != uVar8; uVar7 = uVar7 + 1) {
    if (uVar7 < 6) {
      wVar1 = s_Truths6[uVar7];
      pwVar4 = ppwVar6[uVar7];
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        pwVar4[uVar9] = wVar1;
      }
    }
    else {
      pwVar4 = ppwVar6[uVar7];
      for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        pwVar4[uVar9] = -(ulong)((1 << ((char)uVar7 - 6U & 0x1f) & (uint)uVar9) != 0);
      }
    }
  }
  Gem_PrintNode(p,1,"Original",0);
  return p;
}

Assistant:

Gem_Man_t * Gem_ManAlloc( int nVars, int fVerbose )
{
    Gem_Man_t * p;
    assert( nVars <= 16 );
    p = ABC_CALLOC( Gem_Man_t, 1 );
    p->nVars      = nVars;
    p->nWords     = Abc_TtWordNum( nVars );
    p->nObjsAlloc = 10000000;
    p->nObjs      = 2;
    p->pObjs      = ABC_CALLOC( Gem_Obj_t, p->nObjsAlloc );
    p->pObjs[1].nVars = p->pObjs[1].Groups = 1; // buffer
    p->vTtMem     = Vec_MemAllocForTT( nVars, 0 );
    p->pTtElems   = (word **)Extra_ArrayAlloc( nVars + 4, p->nWords, sizeof(word) );
    p->fVerbose   = fVerbose;
    Abc_TtElemInit( p->pTtElems, nVars );
    Gem_PrintNode( p, 1, "Original", 0 );
    return p;
}